

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall
Graph::Graph(Graph *this,
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *param,int car_capacity,int num_car)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ostream *poVar8;
  long *plVar9;
  Node *pNVar10;
  ulong *puVar11;
  double **ppdVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int *piVar18;
  
  uVar17 = (ulong)num_car;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar17;
  uVar7 = SUB168(auVar6 * ZEXT816(0x30),0) | 8;
  if (SUB168(auVar6 * ZEXT816(0x30),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  this->_vptr_Graph = (_func_int **)&PTR__Graph_0010ad80;
  this->num_car = num_car;
  this->num_node =
       (int)((ulong)((long)(param->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(param->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"constructor!",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"num_car:",8);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,num_car);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," car_capacity:",0xe);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,car_capacity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," num_node(depot + customer):",0x1c);
  plVar9 = (long *)std::ostream::operator<<(poVar8,this->num_node);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  iVar2 = this->num_node;
  lVar16 = (long)iVar2;
  uVar14 = lVar16 << 5;
  if (lVar16 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  pNVar10 = (Node *)operator_new__(uVar14);
  this->nodes = pNVar10;
  puVar11 = (ulong *)operator_new__(uVar7);
  *puVar11 = uVar17;
  if (num_car != 0) {
    lVar15 = 0;
    do {
      puVar1 = (undefined8 *)((long)puVar11 + lVar15 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar11 + lVar15 + 0x30) = 0;
      lVar15 = lVar15 + 0x30;
    } while (uVar17 * 0x30 != lVar15);
  }
  this->cars = (Car *)(puVar11 + 1);
  if (0 < iVar2) {
    pvVar4 = (param->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar18 = &pNVar10->unload_time;
    lVar15 = 0;
    do {
      piVar5 = *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data + lVar15);
      piVar18[-5] = *piVar5;
      ((Node *)(piVar18 + -7))->x = piVar5[1];
      piVar18[-6] = piVar5[2];
      piVar18[-4] = piVar5[3];
      *(bool *)(piVar18 + -3) = false;
      piVar18[-2] = piVar5[4];
      iVar3 = piVar5[5];
      piVar18[-1] = iVar3;
      *piVar18 = (int)((double)(iVar3 - piVar5[4]) * 0.2);
      piVar18 = piVar18 + 8;
      lVar15 = lVar15 + 0x18;
    } while (lVar16 * 0x18 != lVar15);
  }
  if (0 < num_car) {
    lVar15 = 0;
    do {
      *(int *)((long)puVar11 + lVar15 + 8) = car_capacity;
      puVar1 = (undefined8 *)((long)puVar11 + lVar15 + 0xc);
      *puVar1 = 0;
      puVar1[1] = 10;
      lVar15 = lVar15 + 0x30;
    } while ((ulong)(uint)num_car * 0x30 != lVar15);
  }
  uVar7 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar7 = lVar16 << 3;
  }
  ppdVar12 = (double **)operator_new__(uVar7);
  this->distance_matrix = ppdVar12;
  if (0 < iVar2) {
    lVar15 = 0;
    do {
      pdVar13 = (double *)operator_new__(uVar7);
      this->distance_matrix[lVar15] = pdVar13;
      memset(this->distance_matrix[lVar15],0,lVar16 << 3);
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
  }
  calc_node_distance(this);
  return;
}

Assistant:

Graph::Graph(std::vector<std::vector<int> > param,
				int car_capacity, int num_car)
{
	this->num_car = num_car;
	this->num_node = param.size(); 

	std::cout << "constructor!" << std::endl;
	std::cout << "num_car:" << num_car << " car_capacity:" \
		<< car_capacity << " num_node(depot + customer):" << num_node << std::endl;

	nodes = new Node[num_node];
	cars = new Car[num_car];

	for(int i = 0; i < num_node; i++){
		nodes[i].idx = param[i][0];
		nodes[i].x = param[i][1];
		nodes[i].y = param[i][2];
		nodes[i].demand = param[i][3];
		nodes[i].visited = false;
		//time windows
		nodes[i].tw_open = param[i][4];
		nodes[i].tw_close = param[i][5];
		nodes[i].unload_time = (int)(0.2 * (param[i][5] - param[i][4]));
	}

	for(int i = 0; i < num_car; i++){
		cars[i].car_capacity = car_capacity;
		cars[i].now_load = 0;
		cars[i].now_idx = 0;
		//time windows
		cars[i].car_speed = 10;
		cars[i].now_time = 0;
	}

	distance_matrix = new double* [num_node]; 
	for(int i = 0; i < num_node; i++){
		distance_matrix[i] = new double [num_node];
		for(int j = 0; j < num_node; j++){
			distance_matrix[i][j] = 0;// initialization all elements in a row
		}
	}
	calc_node_distance();
}